

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalNinjaGenerator::ConvertToIncludeReference
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *path,
          OutputFormat format,bool forceFullPaths)

{
  cmOutputConverter *this_00;
  char *pcVar1;
  string *this_01;
  undefined3 in_register_00000081;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (CONCAT31(in_register_00000081,forceFullPaths) == 0) {
    pcVar1 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_69);
    cmOutputConverter::ConvertToRelativePath(&local_68,this_00,&local_48,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_68,format);
    std::__cxx11::string::~string((string *)&local_68);
    this_01 = &local_48;
  }
  else {
    cmsys::SystemTools::CollapseFullPath(&local_68,path);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_68,format);
    this_01 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::ConvertToIncludeReference(
  std::string const& path, cmOutputConverter::OutputFormat format,
  bool forceFullPaths)
{
  if (forceFullPaths) {
    return this->ConvertToOutputFormat(cmSystemTools::CollapseFullPath(path),
                                       format);
  }
  return this->ConvertToOutputFormat(
    this->ConvertToRelativePath(this->GetBinaryDirectory(), path), format);
}